

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O0

void custom_compare_commit_compact(bool eqkeys)

{
  fdb_status fVar1;
  byte in_DIL;
  uint64_t user_param;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  fdb_iterator *iterator;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_status status;
  fdb_doc *rdoc;
  char keybuf [1024];
  int n;
  int count;
  int r;
  int j;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  undefined2 in_stack_fffffffffffffa28;
  undefined2 uVar2;
  undefined2 in_stack_fffffffffffffa2a;
  undefined2 uVar3;
  undefined4 in_stack_fffffffffffffa2c;
  fdb_file_handle *in_stack_fffffffffffffa30;
  fdb_kvs_handle *in_stack_fffffffffffffa38;
  size_t valuelen;
  void *in_stack_fffffffffffffa50;
  code *keylen;
  undefined1 *key;
  fdb_kvs_handle *in_stack_fffffffffffffa68;
  fdb_doc **in_stack_fffffffffffffaa0;
  undefined1 uVar4;
  undefined7 in_stack_fffffffffffffaa9;
  fdb_iterator *local_4a0;
  fdb_kvs_handle *local_498;
  fdb_status local_484;
  undefined8 local_480;
  char local_478 [192];
  fdb_config *in_stack_fffffffffffffc48;
  char *in_stack_fffffffffffffc50;
  fdb_file_handle **in_stack_fffffffffffffc58;
  undefined1 local_79;
  int local_68;
  int local_60;
  uint local_5c;
  timeval local_18;
  byte local_1;
  
  local_1 = in_DIL & 1;
  gettimeofday(&local_18,(__timezone_ptr_t)0x0);
  memleak_start();
  local_480 = 0;
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  system("rm -rf  dummy* > errorlog.txt");
  uVar4 = 1;
  valuelen = 0x1234;
  keylen = _cmp_variable;
  key = &stack0xfffffffffffffa48;
  system("rm -rf  dummy* > errorlog.txt");
  local_484 = fdb_open(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,in_stack_fffffffffffffc48
                      );
  if (local_484 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0xad8);
    custom_compare_commit_compact::__test_pass = 0;
    if (local_484 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xad8,"void custom_compare_commit_compact(bool)");
    }
  }
  local_484 = fdb_kvs_open_default
                        (in_stack_fffffffffffffa30,
                         (fdb_kvs_handle **)
                         CONCAT44(in_stack_fffffffffffffa2c,
                                  CONCAT22(in_stack_fffffffffffffa2a,in_stack_fffffffffffffa28)),
                         (fdb_kvs_config *)0x11410f);
  if (local_484 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0xada);
    custom_compare_commit_compact::__test_pass = 0;
    if (local_484 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xada,"void custom_compare_commit_compact(bool)");
    }
  }
  local_5c = 0;
  do {
    if (9 < (int)local_5c) {
      fdb_compact(in_stack_fffffffffffffa30,
                  (char *)CONCAT44(in_stack_fffffffffffffa2c,
                                   CONCAT22(in_stack_fffffffffffffa2a,in_stack_fffffffffffffa28)));
      fdb_commit((fdb_file_handle *)
                 CONCAT44(in_stack_fffffffffffffa2c,
                          CONCAT22(in_stack_fffffffffffffa2a,in_stack_fffffffffffffa28)),'\0');
      fdb_compact(in_stack_fffffffffffffa30,
                  (char *)CONCAT44(in_stack_fffffffffffffa2c,
                                   CONCAT22(in_stack_fffffffffffffa2a,in_stack_fffffffffffffa28)));
      local_68 = 0;
      uVar2 = 0;
      uVar3 = 0;
      fdb_iterator_init(local_498,&local_4a0,(void *)0x0,0,(void *)0x0,0,0);
      do {
        local_484 = fdb_iterator_get((fdb_iterator *)CONCAT71(in_stack_fffffffffffffaa9,uVar4),
                                     in_stack_fffffffffffffaa0);
        if (local_484 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0xaf9);
          custom_compare_commit_compact::__test_pass = 0;
          if (local_484 != FDB_RESULT_SUCCESS) {
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0xaf9,"void custom_compare_commit_compact(bool)");
          }
        }
        fdb_doc_free((fdb_doc *)0x11442e);
        local_480 = 0;
        local_68 = local_68 + 1;
        fVar1 = fdb_iterator_next((fdb_iterator *)
                                  CONCAT44(in_stack_fffffffffffffa2c,CONCAT22(uVar3,uVar2)));
      } while (fVar1 != FDB_RESULT_ITERATOR_FAIL);
      if ((local_1 & 1) == 0) {
        if (local_68 != 10) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0xb04);
          custom_compare_commit_compact::__test_pass = 0;
          if (local_68 != 10) {
            __assert_fail("count == n",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0xb04,"void custom_compare_commit_compact(bool)");
          }
        }
      }
      else if (local_68 != 1) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xb02);
        custom_compare_commit_compact::__test_pass = 0;
        if (local_68 != 1) {
          __assert_fail("count == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xb02,"void custom_compare_commit_compact(bool)");
        }
      }
      fdb_iterator_close((fdb_iterator *)in_stack_fffffffffffffa38);
      fdb_close((fdb_file_handle *)CONCAT44(in_stack_fffffffffffffa2c,CONCAT22(uVar3,uVar2)));
      fdb_shutdown();
      memleak_end();
      if (custom_compare_commit_compact::__test_pass == 0) {
        fprintf(_stderr,"%s FAILED\n","custom compare commit compact");
      }
      else {
        fprintf(_stderr,"%s PASSED\n","custom compare commit compact");
      }
      return;
    }
    if ((local_1 & 1) == 0) {
      sprintf(local_478,"000%d",(ulong)local_5c);
      for (local_60 = 4; local_60 < 0x400; local_60 = local_60 + 1) {
        local_478[local_60] = *custom_compare_commit_compact::achar;
      }
    }
    else {
      sprintf(local_478,"%d",(ulong)local_5c);
      for (local_60 = 1; local_60 < 0x400; local_60 = local_60 + 1) {
        local_478[local_60] = *custom_compare_commit_compact::achar;
      }
    }
    local_79 = 0;
    in_stack_fffffffffffffa38 = local_498;
    strlen(local_478);
    local_484 = fdb_set_kv(in_stack_fffffffffffffa68,key,(size_t)keylen,in_stack_fffffffffffffa50,
                           valuelen);
    if (local_484 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0xaec);
      custom_compare_commit_compact::__test_pass = 0;
      if (local_484 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xaec,"void custom_compare_commit_compact(bool)");
      }
    }
    local_5c = local_5c + 1;
  } while( true );
}

Assistant:

void custom_compare_commit_compact(bool eqkeys)
{
    TEST_INIT();

    memleak_start();

    int i, j, r;
    int count;
    int n = 10;
    static const int len = 1024;
    char keybuf[len];
    static const char *achar = "a";
    fdb_doc *rdoc = NULL;
    fdb_status status;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_iterator *iterator;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.multi_kv_instances = true;

    uint64_t user_param = 0x1234;
    kvs_config.custom_cmp = _cmp_variable;
    kvs_config.custom_cmp_param = (void*)&user_param;

    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;


    // open db
    status = fdb_open(&dbfile, "./dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);


    for (i=0;i<n;++i){
        if(eqkeys){
            sprintf(keybuf, "%d", i);
            for (j=1;j<len;++j) {
                keybuf[j] = *achar;
            }
        } else {
            sprintf(keybuf, "000%d", i);
            for (j=4;j<len;++j) {
                keybuf[j] = *achar;
            }
        }
        keybuf[len-1] = '\0';
        // set kv
        status = fdb_set_kv(db, keybuf, strlen(keybuf), NULL, 0);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // compact pre & post commit
    fdb_compact(dbfile, NULL);
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    fdb_compact(dbfile, NULL);

    // scan after flush
    count = 0;
    fdb_iterator_init(db, &iterator, NULL, 0, NULL, 0, 0x0);
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);
        rdoc = NULL;
        count++;
    } while (fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);

    if (eqkeys) {
        // since the custom cmp function compares only 3rd~8th bytes,
        // all keys are identified as the same key.
        TEST_CHK(count == 1);
    } else {
        TEST_CHK(count == n);
    }

    fdb_iterator_close(iterator);

    fdb_close(dbfile);
    fdb_shutdown();

    memleak_end();
    TEST_RESULT("custom compare commit compact");

}